

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

Image * __thiscall
pbrt::Image::Crop(Image *__return_storage_ptr__,Image *this,Bounds2i *bounds,Allocator alloc)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  Tuple2<pbrt::Point2,_int> p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  Point2i resolution;
  int c;
  Point2i p_00;
  int iVar7;
  int iVar8;
  int iVar9;
  Float value;
  Bounds2iIterator BVar10;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  int va;
  int iStack_74;
  Bounds2i *local_70;
  int vb;
  Bounds2i *local_60;
  Bounds2i *local_58;
  ulong local_50;
  Tuple2<pbrt::Point2,_int> local_48;
  WrapMode2D local_40;
  TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
  local_38;
  
  uVar1 = (bounds->pMin).super_Tuple2<pbrt::Point2,_int>.x;
  uVar2 = (bounds->pMin).super_Tuple2<pbrt::Point2,_int>.y;
  vb = 0;
  iVar7 = (bounds->pMax).super_Tuple2<pbrt::Point2,_int>.y - uVar2;
  iVar9 = (bounds->pMax).super_Tuple2<pbrt::Point2,_int>.x - uVar1;
  iVar8 = iVar7 * iVar9;
  va = iVar8;
  local_60 = bounds;
  if (iVar8 < 1) {
    LogFatal<char_const(&)[14],char_const(&)[2],char_const(&)[14],int&,char_const(&)[2],int&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image.cpp"
               ,0x54a,"Check failed: %s > %s with %s = %s, %s = %s",(char (*) [14])"bounds.Area()",
               (char (*) [2])0x597e5b,(char (*) [14])"bounds.Area()",&va,(char (*) [2])0x597e5b,&vb)
    ;
  }
  if (-1 < (int)(uVar2 | uVar1)) {
    pbVar5 = (this->channelNames).ptr;
    local_38.bits =
         (this->encoding).
         super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
         .bits;
    pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &(this->channelNames).field_2;
    if (pbVar5 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pbVar6 = pbVar5;
    }
    resolution.super_Tuple2<pbrt::Point2,_int>.y = iVar7;
    resolution.super_Tuple2<pbrt::Point2,_int>.x = iVar9;
    channels.n = (this->channelNames).nStored;
    channels.ptr = pbVar6;
    Image(__return_storage_ptr__,this->format,resolution,channels,(ColorEncodingHandle *)&local_38,
          alloc);
    _va = (local_60->pMin).super_Tuple2<pbrt::Point2,_int>;
    local_70 = local_60;
    BVar10 = pbrt::end(local_60);
    local_48 = (Tuple2<pbrt::Point2,_int>)BVar10.p.super_Tuple2<pbrt::Point2,_int>;
    local_50 = (ulong)local_48 >> 0x20;
    while (((p = _va, local_58 = BVar10.bounds, iVar7 = va, iVar8 = iStack_74,
            va != BVar10.p.super_Tuple2<pbrt::Point2,_int>.x || (iStack_74 != (int)local_50)) ||
           (local_70 != local_58))) {
      for (iVar9 = 0; iVar9 < (int)(this->channelNames).nStored; iVar9 = iVar9 + 1) {
        iVar3 = (local_60->pMin).super_Tuple2<pbrt::Point2,_int>.x;
        iVar4 = (local_60->pMin).super_Tuple2<pbrt::Point2,_int>.y;
        WrapMode2D::WrapMode2D(&local_40,Clamp);
        value = GetChannel(this,(Point2i)p,iVar9,local_40);
        p_00.super_Tuple2<pbrt::Point2,_int>.y = iVar8 - iVar4;
        p_00.super_Tuple2<pbrt::Point2,_int>.x = iVar7 - iVar3;
        SetChannel(__return_storage_ptr__,p_00,iVar9,value);
      }
      Bounds2iIterator::operator++((Bounds2iIterator *)&va);
      BVar10.bounds = local_58;
      BVar10.p.super_Tuple2<pbrt::Point2,_int> = local_48;
    }
    return __return_storage_ptr__;
  }
  LogFatal<char_const(&)[41]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image.cpp"
             ,0x54b,"Check failed: %s",(char (*) [41])"bounds.pMin.x >= 0 && bounds.pMin.y >= 0");
}

Assistant:

Image Image::Crop(const Bounds2i &bounds, Allocator alloc) const {
    CHECK_GT(bounds.Area(), 0);
    CHECK(bounds.pMin.x >= 0 && bounds.pMin.y >= 0);
    Image image(format, Point2i(bounds.pMax - bounds.pMin), channelNames, encoding,
                alloc);
    for (Point2i p : bounds)
        for (int c = 0; c < NChannels(); ++c)
            image.SetChannel(Point2i(p - bounds.pMin), c, GetChannel(p, c));
    return image;
}